

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_circle_sector_lines
               (rf_vec2 center,float radius,int start_angle,int end_angle,int segments,
               rf_color color)

{
  _Bool _Var1;
  uint uVar2;
  uchar w;
  uchar z;
  int iVar3;
  ulong uVar4;
  uchar x;
  int v_count;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_78;
  float local_74;
  float local_68;
  float fStack_64;
  uchar local_58;
  
  iVar3 = start_angle;
  if (start_angle < end_angle) {
    iVar3 = end_angle;
  }
  fVar8 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar6 = -0.5 / fVar8 + 1.0;
    fVar6 = fVar6 * fVar6;
    fVar6 = acosf(fVar6 + fVar6 + -1.0);
    iVar3 = iVar3 - start_angle;
    local_74 = (float)iVar3;
    fVar6 = ceilf(6.2831855 / fVar6);
    uVar2 = (uint)((fVar6 * local_74) / 360.0);
    segments = 4;
    if (0 < (int)uVar2) {
      segments = uVar2;
    }
  }
  else {
    iVar3 = iVar3 - start_angle;
    local_74 = (float)iVar3;
  }
  iVar3 = iVar3 % 0x168;
  v_count = segments * 2 + 4;
  if (iVar3 == 0) {
    v_count = segments * 2;
  }
  _Var1 = rf_gfx_check_buffer_limit(v_count);
  if (_Var1) {
    rf_gfx_draw();
  }
  local_78 = (float)start_angle;
  rf_gfx_begin(RF_LINES);
  local_58 = color.g;
  w = color.a;
  z = color.b;
  x = color.r;
  fStack_64 = center.y;
  local_68 = center.x;
  if (iVar3 != 0) {
    rf_gfx_color4ub(x,local_58,z,w);
    rf_gfx_vertex2f(local_68,fStack_64);
    fVar6 = sinf(local_78 * 0.017453292);
    fVar7 = cosf(local_78 * 0.017453292);
    rf_gfx_vertex2f(fVar6 * fVar8 + local_68,fStack_64 + fVar7 * fVar8);
  }
  uVar4 = 0;
  if (0 < segments) {
    uVar4 = (ulong)(uint)segments;
  }
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    rf_gfx_color4ub(x,local_58,z,w);
    fVar6 = sinf(local_78 * 0.017453292);
    fVar7 = cosf(local_78 * 0.017453292);
    rf_gfx_vertex2f(fVar6 * fVar8 + local_68,fVar7 * fVar8 + fStack_64);
    local_78 = local_78 + local_74 / (float)segments;
    fVar6 = sinf(local_78 * 0.017453292);
    fVar7 = cosf(local_78 * 0.017453292);
    rf_gfx_vertex2f(fVar6 * fVar8 + local_68,fVar7 * fVar8 + fStack_64);
  }
  if (iVar3 != 0) {
    rf_gfx_color4ub(x,local_58,z,w);
    rf_gfx_vertex2f(local_68,fStack_64);
    fVar6 = sinf(local_78 * 0.017453292);
    fVar7 = cosf(local_78 * 0.017453292);
    rf_gfx_vertex2f(fVar6 * fVar8 + local_68,fVar8 * fVar7 + fStack_64);
  }
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_circle_sector_lines(rf_vec2 center, float radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (radius <= 0.0f) radius = 0.1f; // Avoid div by zero issue

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;

    // Hide the cap lines when the circle is full
    bool show_cap_lines = true;
    int limit = 2*(segments + 2);
    if ((end_angle - start_angle)%360 == 0) { limit = 2*segments; show_cap_lines = false; }

    if (rf_gfx_check_buffer_limit(limit)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
    }

    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*radius);

        angle += step_length;
    }

    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x, center.y);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*radius, center.y + cosf(RF_DEG2RAD*angle)*radius);
    }
    rf_gfx_end();
}